

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_dictionary_unittest.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_39a3::Test_TemplateDictionary_SetEscapedValue::
Test_TemplateDictionary_SetEscapedValue(Test_TemplateDictionary_SetEscapedValue *this)

{
  value_type local_18;
  Test_TemplateDictionary_SetEscapedValue *local_10;
  Test_TemplateDictionary_SetEscapedValue *this_local;
  
  local_18 = Run;
  local_10 = this;
  std::vector<void_(*)(),_std::allocator<void_(*)()>_>::push_back(&g_testlist,&local_18);
  return;
}

Assistant:

TEST(TemplateDictionary, SetEscapedValue) {
  TemplateDictionary dict("test_SetEscapedValue", NULL);
  TemplateDictionaryPeer peer(&dict);

  dict.SetEscapedValue("hardest HTML",
                       "<A HREF='foo'\nid=\"bar\t\t&&\vbaz\">",
                       GOOGLE_NAMESPACE::html_escape);
  dict.SetEscapedValue("hardest JS",
                       ("f = 'foo';\r\n\tprint \"\\&foo = \b\", \"foo\""),
                       GOOGLE_NAMESPACE::javascript_escape);
  dict.SetEscapedValue("query escape 0", "",
                       GOOGLE_NAMESPACE::url_query_escape);

  EXPECT_TRUE(peer.ValueIs("hardest HTML",
                           "&lt;A HREF=&#39;foo&#39; id=&quot;bar  &amp;&amp; "
                           "baz&quot;&gt;"));
  EXPECT_TRUE(peer.ValueIs("hardest JS",
                           "f \\x3d \\x27foo\\x27;\\r\\n\\tprint \\x22\\\\\\x26"
                           "foo \\x3d \\b\\x22, \\x22foo\\x22"));
  EXPECT_TRUE(peer.ValueIs("query escape 0", ""));

  // Test using hand-made modifiers.
  FooEscaper foo_escaper;
  dict.SetEscapedValue("easy foo", "hello there!",
                       FooEscaper());
  dict.SetEscapedValue("harder foo", "so much to say\nso many foos",
                       foo_escaper);
  DoubleEscaper double_escaper;
  dict.SetEscapedValue("easy double", "doo",
                       double_escaper);
  dict.SetEscapedValue("harder double", "<A HREF='foo'>\n",
                       DoubleEscaper());
  dict.SetEscapedValue("hardest double",
                       "print \"<A HREF='foo'>\";\r\n\\1;",
                       double_escaper);

  EXPECT_TRUE(peer.ValueIs("easy foo", "foo"));
  EXPECT_TRUE(peer.ValueIs("harder foo", "foo"));
  EXPECT_TRUE(peer.ValueIs("easy double", "doo"));
  EXPECT_TRUE(peer.ValueIs("harder double",
                           "\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\n"));
  EXPECT_TRUE(peer.ValueIs("hardest double",
                           "print \\x22\\x3cA HREF\\x3d\\x27foo\\x27\\x3e\\x22;"
                           "\\r\\n\\\\1;"));
}